

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square_tm.hpp
# Opt level: O2

exp_number __thiscall
ising::free_energy::square::transfer_matrix<double>::product_D
          (transfer_matrix<double> *this,vector<double,_std::allocator<double>_> *diag,
          vector<double,_std::allocator<double>_> *diag_10,
          vector<double,_std::allocator<double>_> *diag_20,
          vector<double,_std::allocator<double>_> *diag_01,
          vector<double,_std::allocator<double>_> *diag_02,exp_number *factor,
          vector<double,_std::allocator<double>_> *v,vector<double,_std::allocator<double>_> *v_10,
          vector<double,_std::allocator<double>_> *v_20,
          vector<double,_std::allocator<double>_> *v_01,
          vector<double,_std::allocator<double>_> *v_02)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  pointer pdVar10;
  uint_t c;
  long lVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  exp_number<double> eVar15;
  exp_number eVar16;
  
  pdVar1 = (diag->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar12 = (long)(diag->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pdVar1 >> 3;
  pdVar2 = (diag_20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar4 = (diag_10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (v_10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (diag_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (diag_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar13 = 0.0;
  pdVar8 = (v_20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar9 = (v_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar10 = (v_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start;
  for (lVar11 = 0; lVar12 != lVar11; lVar11 = lVar11 + 1) {
    dVar14 = pdVar4[lVar11];
    pdVar8[lVar11] =
         pdVar1[lVar11] * pdVar8[lVar11] +
         pdVar2[lVar11] * pdVar3[lVar11] + (dVar14 + dVar14) * pdVar5[lVar11];
    pdVar5[lVar11] = pdVar4[lVar11] * pdVar3[lVar11] + pdVar1[lVar11] * pdVar5[lVar11];
    dVar14 = pdVar7[lVar11];
    pdVar10[lVar11] =
         pdVar1[lVar11] * pdVar10[lVar11] +
         pdVar6[lVar11] * pdVar3[lVar11] + (dVar14 + dVar14) * pdVar9[lVar11];
    pdVar9[lVar11] = pdVar7[lVar11] * pdVar3[lVar11] + pdVar1[lVar11] * pdVar9[lVar11];
    dVar14 = pdVar1[lVar11] * pdVar3[lVar11];
    pdVar3[lVar11] = dVar14;
    dVar13 = dVar13 + dVar14 * dVar14;
  }
  if (dVar13 < 0.0) {
    dVar13 = sqrt(dVar13);
  }
  else {
    dVar13 = SQRT(dVar13);
  }
  dVar13 = 1.0 / dVar13;
  pdVar1 = (v_20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (v_10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (v_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (v_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  for (lVar11 = 0; lVar12 != lVar11; lVar11 = lVar11 + 1) {
    pdVar1[lVar11] = pdVar1[lVar11] * dVar13;
    pdVar2[lVar11] = pdVar2[lVar11] * dVar13;
    pdVar3[lVar11] = pdVar3[lVar11] * dVar13;
    pdVar4[lVar11] = pdVar4[lVar11] * dVar13;
    pdVar5[lVar11] = pdVar5[lVar11] * dVar13;
  }
  eVar15 = standards::operator/((standards *)this,factor,dVar13);
  eVar16.log_ = eVar15.log_;
  eVar16._8_8_ = this;
  return eVar16;
}

Assistant:

static exp_number product_D(
      std::vector<real_t> const &diag, std::vector<real_t> const &diag_10,
      std::vector<real_t> const &diag_20, std::vector<real_t> const &diag_01,
      std::vector<real_t> const &diag_02, exp_number factor,
      std::vector<real_t> &v, std::vector<real_t> &v_10,
      std::vector<real_t> &v_20, std::vector<real_t> &v_01,
      std::vector<real_t> &v_02) {
    uint_t dim = diag.size();
    real_t norm2 = 0;
    for (uint_t c = 0; c < dim; ++c) {
      v_20[c] =
          diag_20[c] * v[c] + 2 * diag_10[c] * v_10[c] + diag[c] * v_20[c];
      v_10[c] = diag_10[c] * v[c] + diag[c] * v_10[c];
      v_02[c] =
          diag_02[c] * v[c] + 2 * diag_01[c] * v_01[c] + diag[c] * v_02[c];
      v_01[c] = diag_01[c] * v[c] + diag[c] * v_01[c];
      v[c] = diag[c] * v[c];
      norm2 += v[c] * v[c];
    }
    auto norm_inv = 1 / std::sqrt(norm2);
    for (uint_t c = 0; c < dim; ++c) {
      v_20[c] *= norm_inv;
      v_10[c] *= norm_inv;
      v_02[c] *= norm_inv;
      v_01[c] *= norm_inv;
      v[c] *= norm_inv;
    }
    return factor / norm_inv;
  }